

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.hh
# Opt level: O1

void __thiscall Neural_Network::from_weights(Neural_Network *this,Neural_Network *o)

{
  this->n_inputs = o->n_inputs;
  this->n_hidden_layers = o->n_hidden_layers;
  this->n_hidden_neurons = o->n_hidden_neurons;
  this->n_outputs = o->n_outputs;
  std::function<double_(double)>::operator=(&this->activation,&o->activation);
  std::function<double_(double)>::operator=(&this->activation_derivative,&o->activation_derivative);
  if (this->reserved == false) {
    reserve(this);
  }
  memcpy(this->weights,o->weights,(ulong)this->n_weights << 3);
  memcpy(this->bias,o->bias,(ulong)this->n_bias << 3);
  return;
}

Assistant:

void from_weights(const Neural_Network &o) {
        n_inputs = o.n_inputs;
        n_hidden_layers = o.n_hidden_layers;
        n_hidden_neurons = o.n_hidden_neurons;
        n_outputs = o.n_outputs;
        activation = o.activation;
        activation_derivative = o.activation_derivative;

        if (not reserved) reserve();

        memcpy(weights, o.weights, sizeof(double)*n_weights);
        memcpy(bias, o.bias, sizeof(double)*n_bias);
    }